

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Interpolation interp)

{
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  undefined4 local_14;
  string *psStack_10;
  Interpolation interp_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"constant",&local_16);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_16);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"uniform",&local_17);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_17);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"varying",&local_18);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_18);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"vertex",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case 4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"faceVarying",&local_1a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
    break;
  case 5:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[[Invalid interpolation value]]",&local_15);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[[Invalid interpolation value]]",&local_1b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Interpolation interp) {
  switch (interp) {
    case Interpolation::Invalid:
      return "[[Invalid interpolation value]]";
    case Interpolation::Constant:
      return "constant";
    case Interpolation::Uniform:
      return "uniform";
    case Interpolation::Varying:
      return "varying";
    case Interpolation::Vertex:
      return "vertex";
    case Interpolation::FaceVarying:
      return "faceVarying";
  }

  // Never reach here though
  return "[[Invalid interpolation value]]";
}